

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O0

int ndn_asn1_encode_ecdsa_signature
              (uint8_t *sig_buf,uint32_t raw_ecdsa_sig_len,uint32_t sig_buf_len)

{
  int iVar1;
  uint8_t local_68 [4];
  int sigLen;
  uint8_t sig [72];
  uint32_t sig_buf_len_local;
  uint32_t raw_ecdsa_sig_len_local;
  uint8_t *sig_buf_local;
  
  if (raw_ecdsa_sig_len == 0x40) {
    sig._64_4_ = sig_buf_len;
    sig._68_4_ = raw_ecdsa_sig_len;
    memcpy(sig,sig_buf,0x40);
    iVar1 = encodeSignatureBits(local_68);
    if ((int)sig._64_4_ < iVar1) {
      sig_buf_local._4_4_ = -0x85;
    }
    else {
      memcpy(sig_buf,local_68,(long)iVar1);
      sig_buf_local._4_4_ = 0;
    }
  }
  else {
    sig_buf_local._4_4_ = -0x84;
  }
  return sig_buf_local._4_4_;
}

Assistant:

int
ndn_asn1_encode_ecdsa_signature(uint8_t* sig_buf, uint32_t raw_ecdsa_sig_len,
                                uint32_t sig_buf_len)
{
  if (raw_ecdsa_sig_len != 64) {
    return NDN_ASN1_ECDSA_SIG_INVALID_SIZE;
  }
  uint8_t sig[72];
  memcpy(&sig[8], sig_buf, 64);
  int sigLen = encodeSignatureBits(sig);
  if (sigLen > (int)sig_buf_len) {
    return NDN_ASN1_ECDSA_SIG_BUFFER_TOO_SMALL;
  }
  memcpy(sig_buf, sig, sigLen);
  return NDN_SUCCESS;
}